

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O0

int If_CutComputeDelay(If_Man_t *p,If_Cut_t *pCut,char *pCanonPerm,word DelayProfile)

{
  float fVar1;
  int iVar2;
  int iVar3;
  If_Obj_t *pObj;
  If_Cut_t *pIVar4;
  int local_40;
  int delayMax;
  int delayTemp;
  int i;
  int nLeaves;
  If_Obj_t *pLeaf;
  word DelayProfile_local;
  char *pCanonPerm_local;
  If_Cut_t *pCut_local;
  If_Man_t *p_local;
  
  iVar2 = If_CutLeaveNum(pCut);
  local_40 = -1000000000;
  for (delayMax = 0; delayMax < iVar2; delayMax = delayMax + 1) {
    pObj = If_ManObj(p,(int)(&pCut[1].Area)[(int)pCanonPerm[delayMax]]);
    pIVar4 = If_ObjCutBest(pObj);
    fVar1 = pIVar4->Delay;
    iVar3 = Lms_DelayGet(DelayProfile,delayMax);
    local_40 = Abc_MaxInt(local_40,(int)(fVar1 + (float)iVar3));
  }
  return local_40;
}

Assistant:

static inline int If_CutComputeDelay( If_Man_t * p, If_Cut_t * pCut, char * pCanonPerm, word DelayProfile )
{
    If_Obj_t* pLeaf;
    int nLeaves = If_CutLeaveNum(pCut);
    int i, delayTemp, delayMax = -ABC_INFINITY;
    for ( i = 0; i < nLeaves; i++ )
    {
        pLeaf     = If_ManObj(p, (pCut)->pLeaves[(int)pCanonPerm[i]]);
        delayTemp = If_ObjCutBest(pLeaf)->Delay + Lms_DelayGet(DelayProfile, i);
        delayMax  = Abc_MaxInt( delayMax, delayTemp );
    }
    return delayMax;
}